

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_openMagicStream(PHYSFS_File *handle)

{
  FileHandle *fh;
  PHYSFS_File *handle_local;
  
  if (magicStream == (FileHandle *)0x0) {
    if (handle == (PHYSFS_File *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
      handle_local._4_4_ = 0;
    }
    else if (*(char *)&handle[1].opaque == '\0') {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
      handle_local._4_4_ = 0;
    }
    else {
      handle_local._4_4_ = 1;
      magicStream = (FileHandle *)handle;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_FILES_STILL_OPEN);
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int PHYSFS_openMagicStream(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *)handle;
    BAIL_IF(magicStream != NULL, PHYSFS_ERR_FILES_STILL_OPEN, 0);
    BAIL_IF(!handle, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fh->forReading, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    magicStream = fh;
    return 1;
}